

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_ocb_hw.c
# Opt level: O0

int cipher_hw_aes_ocb_generic_initkey(PROV_CIPHER_CTX *vctx,uchar *key,size_t keylen)

{
  int iVar1;
  block128_f in_RDX;
  uchar *in_RSI;
  block128_f in_RDI;
  PROV_AES_OCB_CTX *ctx;
  block128_f p_Var2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((DAT_005e9d1c & 0x200) == 0) {
    p_Var2 = in_RDI;
    CRYPTO_ocb128_cleanup((OCB128_CONTEXT *)0x2f63bf);
    AES_set_encrypt_key(in_RSI,(int)((long)in_RDX << 3),(AES_KEY *)(in_RDI + 0xc0));
    AES_set_decrypt_key(in_RSI,(int)((long)in_RDX << 3),(AES_KEY *)(in_RDI + 0x1b8));
    iVar1 = CRYPTO_ocb128_init((OCB128_CONTEXT *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),p_Var2,
                               in_RSI,in_RDX,in_RDI,(ocb128_f)0x2f644d);
    if (iVar1 == 0) {
      return 0;
    }
    in_RDI[0x364] = (_func_void_uchar_ptr_uchar_ptr_void_ptr)((byte)in_RDI[0x364] & 0xfe | 1);
  }
  else {
    p_Var2 = in_RDI;
    CRYPTO_ocb128_cleanup((OCB128_CONTEXT *)0x2f62f4);
    vpaes_set_encrypt_key(in_RSI,((ulong)in_RDX & 0x1fffffff) << 3,in_RDI + 0xc0);
    vpaes_set_decrypt_key(in_RSI,((ulong)in_RDX & 0x1fffffff) << 3,in_RDI + 0x1b8);
    iVar1 = CRYPTO_ocb128_init((OCB128_CONTEXT *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),p_Var2,
                               in_RSI,in_RDX,in_RDI,(ocb128_f)0x2f6382);
    if (iVar1 == 0) {
      return 0;
    }
    in_RDI[0x364] = (_func_void_uchar_ptr_uchar_ptr_void_ptr)((byte)in_RDI[0x364] & 0xfe | 1);
  }
  return 1;
}

Assistant:

static int cipher_hw_aes_ocb_generic_initkey(PROV_CIPHER_CTX *vctx,
                                             const unsigned char *key,
                                             size_t keylen)
{
    PROV_AES_OCB_CTX *ctx = (PROV_AES_OCB_CTX *)vctx;

/*
 * We set both the encrypt and decrypt key here because decrypt
 * needs both. (i.e- AAD uses encrypt).
 */
# ifdef HWAES_CAPABLE
    if (HWAES_CAPABLE) {
        OCB_SET_KEY_FN(HWAES_set_encrypt_key, HWAES_set_decrypt_key,
                       HWAES_encrypt, HWAES_decrypt,
                       HWAES_ocb_encrypt, HWAES_ocb_decrypt);
    } else
# endif
# ifdef VPAES_CAPABLE
    if (VPAES_CAPABLE) {
        OCB_SET_KEY_FN(vpaes_set_encrypt_key, vpaes_set_decrypt_key,
                       vpaes_encrypt, vpaes_decrypt, NULL, NULL);
    } else
# endif
    {
        OCB_SET_KEY_FN(AES_set_encrypt_key, AES_set_decrypt_key,
                       AES_encrypt, AES_decrypt, NULL, NULL);
    }
    return 1;
}